

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  uv_tcp_t h;
  undefined1 auStack_208 [248];
  code *pcStack_110;
  undefined1 local_100 [248];
  
  pcStack_110 = (code *)0x16967c;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x16968c;
  uv_tcp_init(uVar2,local_100);
  pcStack_110 = (code *)0x1696a0;
  uv_listen(local_100,0x80,fail_cb);
  pcStack_110 = (code *)0x1696a8;
  uv_unref(local_100);
  pcStack_110 = (code *)0x1696ad;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1696b7;
  uv_run(uVar2,0);
  pcStack_110 = (code *)0x1696bf;
  do_close(local_100);
  pcStack_110 = (code *)0x1696c4;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1696d8;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_110 = (code *)0x1696e2;
  uv_run(uVar2,0);
  pcStack_110 = (code *)0x1696e7;
  uVar3 = uv_default_loop();
  pcStack_110 = (code *)0x1696ef;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_110 = run_test_tcp_ref2b;
  run_test_tcp_ref2_cold_1();
  pcStack_110 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,auStack_208);
  uv_listen(auStack_208,0x80,fail_cb);
  uv_unref(auStack_208);
  uv_close(auStack_208,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called == 1) {
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_ref2b_cold_1();
  }
  run_test_tcp_ref2b_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref2) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}